

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O2

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
VisitImplication(ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
                 *this,ImplicationExpr e)

{
  ExprBase e_00;
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  
  Visit(this,(LogicalExpr)
             ((ExprBase *)
             ((long)e.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_ +
             8))->impl_,-1);
  value.size_ = 5;
  value.data_ = " ==> ";
  fmt::BasicWriter<char>::operator<<(this->writer_,value);
  Visit(this,(LogicalExpr)
             ((ExprBase *)
             ((long)e.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_ +
             0x10))->impl_,4);
  e_00.impl_ = ((ExprBase *)
               ((long)e.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_
               + 0x18))->impl_;
  if (((e_00.impl_)->kind_ == 0x30) && (*(char *)(e_00.impl_ + 1) != '\x01')) {
    return;
  }
  value_00.size_ = 6;
  value_00.data_ = " else ";
  fmt::BasicWriter<char>::operator<<(this->writer_,value_00);
  Visit(this,(LogicalExpr)e_00.impl_,-1);
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::VisitImplication(ImplicationExpr e) {
  Visit(e.condition());
  writer_ << " ==> ";
  Visit(e.then_expr(), prec::IMPLICATION + 1);
  LogicalExpr else_expr = e.else_expr();
  LogicalConstant c = ExprTypes::template Cast<LogicalConstant>(else_expr);
  if (!c || c.value() != 0) {
    writer_ << " else ";
    Visit(else_expr);
  }
}